

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O1

void miss(char *er,char *ee,bool noend)

{
  int iVar1;
  int iVar2;
  
  if (!to_death) {
    prname(er,true);
    iVar1 = 0;
    addmsg(prname::tbuf);
    if (terse == false) {
      iVar1 = rnd(4);
    }
    iVar2 = iVar1 + 4;
    if (er == (char *)0x0) {
      iVar2 = iVar1;
    }
    addmsg(m_names[iVar2]);
    if (terse == false) {
      prname::tbuf._0_4_ = prname::tbuf._0_4_ & 0xffffff00;
      if (ee == (char *)0x0) {
        builtin_strncpy(prname::tbuf,"you",4);
      }
      else {
        strcpy(prname::tbuf,ee);
      }
      addmsg(" %s",prname::tbuf);
    }
    if (!noend) {
      if (save_msg == true) {
        strcpy(huh,msgbuf);
      }
      iVar2 = (int)msgbuf[0];
      iVar1 = islower(iVar2);
      if (((iVar1 != 0) && (lower_msg == false)) && (msgbuf[1] != ')')) {
        iVar1 = toupper(iVar2);
        msgbuf[0] = (char)iVar1;
      }
      if (msgbuf[0] != '\0') {
        displayMessage(msgbuf);
      }
      newpos = 0;
      msgbuf[0] = '\0';
      return;
    }
  }
  return;
}

Assistant:

void miss(const char *er, const char *ee, bool noend)
{
    int i;

    if (to_death)
        return;
    addmsg(prname(er, true));
    if (terse)
        i = 0;
    else
        i = rnd(4);
    if (er != nullptr)
        i += 4;
    addmsg(m_names[i]);
    if (!terse)
        addmsg(" %s", prname(ee, false));
    if (!noend)
        endmsg();
}